

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_WiningStateTest_HeavenlyHand_TestShell::createTest
          (TEST_WiningStateTest_HeavenlyHand_TestShell *this)

{
  TEST_WiningStateTest_HeavenlyHand_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_WiningStateTest_HeavenlyHand_TestShell *this_local;
  
  this_00 = (TEST_WiningStateTest_HeavenlyHand_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_WiningStateTest_HeavenlyHand_Test::TEST_WiningStateTest_HeavenlyHand_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, HeavenlyHand)
{
	addNoWiningHand();
		
	SelfDrawnSituation situation;
	situation.is_uninterrupted_first_drawn = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::HeavenlyHand));
	CHECK_EQUAL(100, r.doubling_factor);
}